

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O2

int CaptureLeafPlain(void **stack,int stack_len)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  
  expected_range[0].start = (void *)0x1025dc;
  expected_range[0].end = (void *)0x102602;
  uVar1 = GetStackTrace(stack,stack_len,0);
  printf("Obtained %d stack frames.\n",(ulong)uVar1);
  if ((int)uVar1 < 1) {
    pcVar4 = "1";
    pcVar3 = ">=";
    uVar2 = 0xdd;
  }
  else {
    if ((int)uVar1 <= stack_len) {
      return uVar1;
    }
    pcVar4 = "stack_len";
    pcVar3 = "<=";
    uVar2 = 0xde;
  }
  fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stacktrace_unittest.cc"
          ,uVar2,"size",pcVar3,pcVar4);
  abort();
}

Assistant:

int ATTRIBUTE_NOINLINE CaptureLeafPlain(void **stack, int stack_len) {
  INIT_ADDRESS_RANGE(CheckStackTraceLeaf, start, end, &expected_range[0]);
  DECLARE_ADDRESS_LABEL(start);

  int size = GetStackTrace(stack, stack_len, 0);

  printf("Obtained %d stack frames.\n", size);
  CHECK_GE(size, 1);
  CHECK_LE(size, stack_len);

  DECLARE_ADDRESS_LABEL(end);

  return size;
}